

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::ReportLeaksOnProcessDetach(Recycler *this)

{
  bool bVar1;
  AutoLeakReportSection local_18;
  AutoLeakReportSection __autoLeakReportSection2;
  
  bVar1 = Js::ConfigFlagsTable::IsEnabled(this->recyclerFlagsTable,LeakReportFlag);
  if (bVar1) {
    AutoLeakReportSection::AutoLeakReportSection
              (&local_18,this->recyclerFlagsTable,L"Recycler (%p): Process Termination",this);
    LeakReport::StartRedirectOutput();
    (**(((this->markContext).pagePool)->pageAllocator)._vptr_PageAllocatorBase)();
    if (((this->collectionState).value & Collection_Concurrent) != CollectionStateNotCollecting) {
      AbortConcurrent(this,true);
    }
    if ((this->collectionState).value == CollectionStateNotCollecting) {
      this->externalRootMarker = (ExternalRootMarker)0x0;
      this->externalRootMarkerContext = (void *)0x0;
      ResetThreadId(this);
      ReportLeaks(this);
    }
    else {
      Output::Print(L"WARNING: Thread terminated during GC.  Can\'t dump object graph\n");
    }
    LeakReport::EndRedirectOutput();
    AutoLeakReportSection::~AutoLeakReportSection(&local_18);
  }
  return;
}

Assistant:

void
Recycler::ReportLeaksOnProcessDetach()
{
    if (GetRecyclerFlagsTable().IsEnabled(Js::LeakReportFlag))
    {
        AUTO_LEAK_REPORT_SECTION(this->GetRecyclerFlagsTable(), _u("Recycler (%p): Process Termination"), this);
        LeakReport::StartRedirectOutput();
        ReportOnProcessDetach([=]() { this->ReportLeaks(); });
        LeakReport::EndRedirectOutput();
    }
}